

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O0

Result tonk::InitializeAddressHash(void)

{
  ErrorResult *in_RDI;
  uint in_stack_0000002c;
  Result result;
  ErrorResult *this;
  char *local_28 [2];
  long *local_18;
  long *local_10;
  
  this = in_RDI;
  SecureRandom_Next((uint8_t *)result.Error,in_stack_0000002c);
  local_18 = (long *)local_28;
  if (local_28[0] == (char *)0x0) {
    m_SeedInitialized = 1;
    Result::Success();
  }
  else {
    local_10 = (long *)local_28;
    this->Source = local_28[0];
    local_28[0] = (char *)0x0;
  }
  Result::~Result((Result *)this);
  return (Result)in_RDI;
}

Assistant:

Result InitializeAddressHash()
{
    Result result = SecureRandom_Next((uint8_t*)&m_SecretSeed, sizeof(m_SecretSeed));
    if (result.IsFail()) {
        return result;
    }

    m_SeedInitialized = true;
    return Result::Success();
}